

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O0

optional<yactfr::ByteOrder> __thiscall yactfr::internal::TsdlAttr::_toBo(TsdlAttr *this)

{
  TextLocation loc;
  bool bVar1;
  ostream *poVar2;
  TextLocation local_1e8;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream ss;
  ByteOrder local_20 [2];
  TsdlAttr *local_18;
  TsdlAttr *this_local;
  
  local_18 = this;
  bVar1 = std::operator==(&this->strVal,"be");
  if ((bVar1) || (bVar1 = std::operator==(&this->strVal,"network"), bVar1)) {
    local_20[1] = 0;
    boost::optional<yactfr::ByteOrder>::optional
              ((optional<yactfr::ByteOrder> *)&this_local,local_20 + 1);
    return (optional<yactfr::ByteOrder>)(type)this_local;
  }
  bVar1 = std::operator==(&this->strVal,"le");
  if (bVar1) {
    local_20[0] = Little;
    boost::optional<yactfr::ByteOrder>::optional
              ((optional<yactfr::ByteOrder> *)&this_local,local_20);
    return (optional<yactfr::ByteOrder>)(type)this_local;
  }
  bVar1 = std::operator==(&this->strVal,"native");
  if (bVar1) {
    boost::optional<yactfr::ByteOrder>::optional((optional<yactfr::ByteOrder> *)&this_local);
    return (optional<yactfr::ByteOrder>)(type)this_local;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,"Invalid byte order `");
  poVar2 = std::operator<<(poVar2,(string *)&this->strVal);
  std::operator<<(poVar2,"`.");
  std::__cxx11::ostringstream::str();
  valTextLoc(&local_1e8,this);
  loc._lineNumber = local_1e8._lineNumber;
  loc._offset = local_1e8._offset;
  loc._colNumber = local_1e8._colNumber;
  throwTextParseError(&local_1d0,loc);
}

Assistant:

boost::optional<ByteOrder> TsdlAttr::_toBo() const
{
    if (strVal == "be" || strVal == "network") {
        return ByteOrder::Big;
    } else if (strVal == "le") {
        return ByteOrder::Little;
    } else if (strVal == "native") {
        return boost::none;
    }

    std::ostringstream ss;

    ss << "Invalid byte order `" << strVal << "`.";
    throwTextParseError(ss.str(), this->valTextLoc());
}